

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_enc.c
# Opt level: O2

int CompressAlphaJob(void *arg1,void *unused)

{
  int effort_level;
  uint method;
  uint uVar1;
  uint dst_stride;
  uint height;
  long lVar2;
  int *piVar3;
  bool bVar4;
  int iVar5;
  WEBP_FILTER_TYPE WVar6;
  uint8_t *dst;
  ulong uVar7;
  long lVar8;
  uint8_t *puVar9;
  ulong uVar10;
  size_t size;
  uint uVar11;
  ulong uVar12;
  int filter;
  char cVar13;
  ulong uVar14;
  uint64_t local_238;
  long local_230;
  FilterTrial best;
  FilterTrial local_128;
  
  lVar8 = *arg1;
  lVar2 = *(long *)((long)arg1 + 8);
  effort_level = *(int *)(lVar8 + 8);
  method = *(uint *)(lVar8 + 0x30);
  uVar1 = *(uint *)(lVar8 + 0x38);
  dst_stride = *(uint *)(lVar2 + 8);
  height = *(uint *)(lVar2 + 0xc);
  local_238 = 0;
  if (1 < method || 100 < uVar1) {
    return 0;
  }
  size = (long)(int)height * (long)(int)dst_stride;
  cVar13 = (*(int *)(lVar8 + 0x34) == 1) + '\x05';
  if (*(int *)(lVar8 + 0x34) == 0) {
    cVar13 = '\0';
  }
  if (method == 0) {
    cVar13 = '\0';
  }
  dst = (uint8_t *)WebPSafeMalloc(1,size);
  if (dst == (uint8_t *)0x0) {
    return 0;
  }
  WebPCopyPlane(*(uint8_t **)(lVar2 + 0x30),*(int *)(lVar2 + 0x38),dst,dst_stride,dst_stride,height)
  ;
  if ((int)uVar1 < 100) {
    if (uVar1 < 0x47) {
      uVar11 = (uint)(byte)((char)(((ushort)uVar1 & 0xff) / 5) + 2);
    }
    else {
      uVar11 = uVar1 * 8 - 0x220;
    }
    iVar5 = QuantizeLevels(dst,dst_stride,height,uVar11,&local_238);
    if (iVar5 == 0) {
      puVar9 = (uint8_t *)0x0;
      uVar7 = 0;
      bVar4 = false;
      goto LAB_00128b4c;
    }
  }
  VP8FiltersInit();
  local_230 = *(long *)(lVar2 + 0x80);
  if (cVar13 == '\0') {
    uVar11 = 1;
  }
  else if (cVar13 == '\x06') {
    uVar14 = 0;
    memset(&best,0,0x100);
    uVar7 = 0;
    if (0 < (int)dst_stride) {
      uVar7 = (ulong)dst_stride;
    }
    uVar10 = 0;
    puVar9 = dst;
    if (0 < (int)height) {
      uVar10 = (ulong)height;
    }
    for (; uVar14 != uVar10; uVar14 = uVar14 + 1) {
      for (uVar12 = 0; uVar7 != uVar12; uVar12 = uVar12 + 1) {
        *(undefined1 *)((long)best.stats.PSNR + ((ulong)puVar9[uVar12] - 0x3c)) = 1;
      }
      puVar9 = puVar9 + (int)dst_stride;
    }
    uVar11 = 0;
    for (lVar8 = 0; lVar8 != 0x100; lVar8 = lVar8 + 1) {
      uVar11 = (uVar11 + 1) - (uint)(*(char *)((long)best.stats.PSNR + lVar8 + -0x3c) == '\0');
    }
    WVar6 = WEBP_FILTER_NONE;
    if (0x10 < uVar11) {
      WVar6 = WebPEstimateBestFilter(dst,dst_stride,height,dst_stride);
    }
    uVar11 = (uint)(0xc0 < uVar11 || 3 < effort_level) | 1 << (WVar6 & 0x1f);
  }
  else {
    uVar11 = 0xf;
  }
  best.score = 0xffffffff;
  bVar4 = false;
  VP8BitWriterInit(&best.bw,0);
  if (uVar11 == 1) {
    iVar5 = EncodeAlphaInternal(dst,dst_stride,height,method,0,(uint)((int)uVar1 < 100),effort_level
                                ,(uint8_t *)0x0,&best);
LAB_00128abf:
    if (iVar5 == 0) {
      VP8BitWriterWipeOut(&best.bw);
      best.bw.buf_ = (uint8_t *)0x0;
      best.bw.pos_ = 0;
      bVar4 = false;
    }
    else {
      if (local_230 != 0) {
        *(undefined8 *)(local_230 + 0x94) = best.stats._148_8_;
        *(undefined8 *)(local_230 + 0x9c) = best.stats._156_8_;
        *(undefined8 *)(local_230 + 0xa4) = best.stats._164_8_;
        *(undefined8 *)(local_230 + 0xac) = best.stats._172_8_;
      }
      bVar4 = true;
    }
  }
  else {
    puVar9 = (uint8_t *)WebPSafeMalloc(1,size);
    if (puVar9 != (uint8_t *)0x0) {
      filter = 0;
      iVar5 = 1;
      for (; (iVar5 != 0 && (uVar11 != 0)); uVar11 = uVar11 >> 1) {
        iVar5 = 1;
        if ((uVar11 & 1) != 0) {
          iVar5 = EncodeAlphaInternal(dst,dst_stride,height,method,filter,(uint)((int)uVar1 < 100),
                                      effort_level,puVar9,&local_128);
          if ((iVar5 == 0) || (best.score <= local_128.score)) {
            VP8BitWriterWipeOut(&local_128.bw);
          }
          else {
            VP8BitWriterWipeOut(&best.bw);
            memcpy(&best,&local_128,0xf8);
          }
        }
        filter = filter + 1;
      }
      WebPSafeFree(puVar9);
      goto LAB_00128abf;
    }
    best.bw.buf_ = (uint8_t *)0x0;
    best.bw.pos_ = 0;
  }
  piVar3 = *(int **)(lVar2 + 0x80);
  puVar9 = best.bw.buf_;
  uVar7 = best.bw.pos_;
  if (piVar3 != (int *)0x0) {
    *piVar3 = *piVar3 + (int)best.bw.pos_;
    *(uint64_t *)((long)arg1 + 0x5bf0) = local_238;
  }
LAB_00128b4c:
  WebPSafeFree(dst);
  if (!bVar4) {
    return 0;
  }
  if (uVar7 >> 0x20 != 0) {
    WebPSafeFree(puVar9);
    return 0;
  }
  *(int *)((long)arg1 + 0x228) = (int)uVar7;
  *(uint8_t **)((long)arg1 + 0x220) = puVar9;
  return 1;
}

Assistant:

static int CompressAlphaJob(void* arg1, void* unused) {
  VP8Encoder* const enc = (VP8Encoder*)arg1;
  const WebPConfig* config = enc->config_;
  uint8_t* alpha_data = NULL;
  size_t alpha_size = 0;
  const int effort_level = config->method;  // maps to [0..6]
  const WEBP_FILTER_TYPE filter =
      (config->alpha_filtering == 0) ? WEBP_FILTER_NONE :
      (config->alpha_filtering == 1) ? WEBP_FILTER_FAST :
                                       WEBP_FILTER_BEST;
  if (!EncodeAlpha(enc, config->alpha_quality, config->alpha_compression,
                   filter, effort_level, &alpha_data, &alpha_size)) {
    return 0;
  }
  if (alpha_size != (uint32_t)alpha_size) {  // Soundness check.
    WebPSafeFree(alpha_data);
    return 0;
  }
  enc->alpha_data_size_ = (uint32_t)alpha_size;
  enc->alpha_data_ = alpha_data;
  (void)unused;
  return 1;
}